

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.hpp
# Opt level: O1

Uint32 __thiscall Diligent::ShaderVkImpl::GetResourceCount(ShaderVkImpl *this)

{
  element_type *peVar1;
  uint uVar2;
  string msg;
  string local_30;
  
  if ((this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i < SHADER_STATUS_READY) {
    FormatString<char[109]>
              (&local_30,
               (char (*) [109])
               "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetResourceCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderVkImpl.hpp"
               ,0x4a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  peVar1 = (this->m_pShaderResources).
           super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)peVar1->m_TotalResources;
  }
  return uVar2;
}

Assistant:

GetResourceCount() const override final
    {
        DEV_CHECK_ERR(!IsCompiling(), "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");
        return m_pShaderResources ? m_pShaderResources->GetTotalResources() : 0;
    }